

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O0

Parse_ast * __thiscall
lambda::parse_from(std::istream&)::helper::parse_app_list(lambda::Parse_ast_
          (Parse_ast *__return_storage_ptr__,void *this,Parse_ast *fst)

{
  int iVar1;
  Parse_error *this_00;
  string local_1d8;
  Variable local_1b8;
  Parse_ast local_198;
  Parse_ast local_168;
  Call local_138;
  Parse_ast local_128;
  undefined1 local_f1;
  Shared_string local_f0;
  Parse_ast local_c8;
  Parse_ast local_98;
  Call local_68;
  Parse_ast local_58;
  int local_24;
  Parse_ast *pPStack_20;
  int_type ch;
  Parse_ast *fst_local;
  helper *this_local;
  
  pPStack_20 = fst;
  fst_local = (Parse_ast *)this;
  this_local = (helper *)__return_storage_ptr__;
  parse_from::helper::eat_whitespace((helper *)this);
  local_24 = std::istream::peek();
  if (local_24 != -1) {
    if (local_24 == 0x28) {
      lambda::Parse_ast::Parse_ast(&local_98,fst);
      parse_from::helper::parse_term(&local_c8,(helper *)this);
      lambda::Parse_ast::Call::Call(&local_68,&local_98,&local_c8);
      lambda::Parse_ast::Parse_ast(&local_58,&local_68);
      Parse_ast_(__return_storage_ptr__,this,&local_58);
      lambda::Parse_ast::~Parse_ast(&local_58);
      lambda::Parse_ast::Call::~Call(&local_68);
      lambda::Parse_ast::~Parse_ast(&local_c8);
      lambda::Parse_ast::~Parse_ast(&local_98);
      return __return_storage_ptr__;
    }
    if (local_24 != 0x29) {
      if ((local_24 == 0x2f) || (local_24 == 0x5c)) {
        local_f1 = 1;
        this_00 = (Parse_error *)__cxa_allocate_exception(0x20);
        ublib::Shared_string::Shared_string(&local_f0,"attempted to define a lambda in a callee");
        Parse_error::Parse_error(this_00,&local_f0);
        local_f1 = 0;
        __cxa_throw(this_00,&Parse_error::typeinfo,Parse_error::~Parse_error);
      }
      iVar1 = isalpha(local_24);
      if ((iVar1 == 0) && (local_24 != 0x5f)) {
        parse_from::helper::unexpected_thing((helper *)this);
      }
      lambda::Parse_ast::Parse_ast(&local_168,fst);
      parse_from(std::istream&)::helper::get_var_abi_cxx11_(&local_1d8,this);
      lambda::Parse_ast::Variable::Variable(&local_1b8,&local_1d8);
      lambda::Parse_ast::Parse_ast(&local_198,&local_1b8);
      lambda::Parse_ast::Call::Call(&local_138,&local_168,&local_198);
      lambda::Parse_ast::Parse_ast(&local_128,&local_138);
      Parse_ast_(__return_storage_ptr__,this,&local_128);
      lambda::Parse_ast::~Parse_ast(&local_128);
      lambda::Parse_ast::Call::~Call(&local_138);
      lambda::Parse_ast::~Parse_ast(&local_198);
      lambda::Parse_ast::Variable::~Variable(&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      lambda::Parse_ast::~Parse_ast(&local_168);
      return __return_storage_ptr__;
    }
  }
  lambda::Parse_ast::Parse_ast(__return_storage_ptr__,fst);
  return __return_storage_ptr__;
}

Assistant:

Parse_ast parse_app_list(Parse_ast fst) {
      eat_whitespace();
      auto ch = inp.peek();

      switch (ch) {
      case ')':
      case eof:
        return fst;
      case '(': {
        return parse_app_list(Parse_ast::Call(std::move(fst), parse_term()));
      }
      case '/':
      case '\\':
        throw Parse_error("attempted to define a lambda in a callee");
      default:
        if (std::isalpha(ch) or ch == '_') {
          return parse_app_list(
              Parse_ast::Call(std::move(fst), Parse_ast::Variable(get_var())));
        } else {
          unexpected_thing();
        }
      }
    }